

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

int av1_get_sbq_perceptual_ai(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int c;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int r;
  uint uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if ((cpi->oxcf).enable_rate_guide_deltaq == 0) {
    iVar9 = (cpi->common).quant_params.base_qindex;
    iVar4 = get_var_perceptual_ai(cpi,bsize,mi_row,mi_col);
    lVar2 = cpi->norm_wiener_variance;
    dVar12 = get_max_scale(cpi,bsize,mi_row,mi_col);
    dVar10 = 1.0;
    if (1.0 <= dVar12) {
      dVar10 = dVar12;
    }
    dVar12 = 1.0 / ((double)lVar2 / (double)iVar4);
    if (dVar10 <= dVar12) {
      dVar12 = dVar10;
    }
    dVar12 = 1.0 / dVar12;
    if (4.0 <= dVar12) {
      dVar12 = 4.0;
    }
    if (dVar12 <= 0.25) {
      dVar12 = 0.25;
    }
    iVar3 = av1_get_deltaq_offset(((cpi->common).seq_params)->bit_depth,iVar9,dVar12);
    iVar4 = (cpi->common).delta_q_info.delta_q_res;
    iVar6 = iVar4 * 0x14 + -1;
    if (iVar3 < iVar6) {
      iVar6 = iVar3;
    }
    iVar4 = iVar4 * -0x14 + 1;
    if (iVar4 < iVar6) {
      iVar4 = iVar6;
    }
  }
  else {
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [cpi->weber_bsize];
    iVar9 = (cpi->frame_info).mi_cols;
    dVar10 = 0.0;
    dVar12 = 0.0;
    iVar4 = mi_row;
    do {
      iVar6 = mi_col;
      do {
        uVar8 = 0;
        do {
          uVar7 = (uint)bVar1;
          uVar5 = 0;
          do {
            dVar12 = dVar12 + (double)cpi->prep_rate_estimates
                                      [(int)(iVar6 + uVar5) / (int)uVar7 +
                                       ((int)(uVar8 + iVar4) / (int)uVar7) * iVar9];
            uVar5 = uVar5 + uVar7;
          } while (uVar5 < 4);
          uVar8 = uVar8 + uVar7;
        } while (uVar8 < 4);
        dVar10 = dVar10 + cpi->ext_rate_distribution
                          [iVar6 / (int)(uint)bVar1 + (iVar4 / (int)(uint)bVar1) * iVar9];
        iVar6 = iVar6 + 4;
      } while (iVar6 < (int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                   [bsize] + mi_col));
      iVar4 = iVar4 + 4;
    } while (iVar4 < (int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [bsize] + mi_row));
    dVar12 = exp2((dVar10 * cpi->ext_rate_scale - dVar12) / dVar12);
    dVar11 = get_max_scale(cpi,bsize,mi_row,mi_col);
    dVar10 = 1.0;
    if (1.0 <= dVar11) {
      dVar10 = dVar11;
    }
    dVar12 = 1.0 / (dVar12 * dVar12);
    if (dVar10 <= dVar12) {
      dVar12 = dVar10;
    }
    iVar9 = (cpi->common).quant_params.base_qindex;
    iVar3 = av1_get_deltaq_offset(((cpi->common).seq_params)->bit_depth,iVar9,1.0 / dVar12);
    iVar4 = (cpi->common).delta_q_info.delta_q_res;
    iVar6 = iVar4 * 10 + -1;
    if (iVar3 < iVar6) {
      iVar6 = iVar3;
    }
    iVar4 = iVar4 * -10 + 1;
    if (iVar4 < iVar6) {
      iVar4 = iVar6;
    }
  }
  uVar8 = iVar4 + (cpi->common).quant_params.base_qindex;
  if (0xfe < (int)uVar8) {
    uVar8 = 0xff;
  }
  if ((int)uVar8 < (int)(uint)(0 < iVar9)) {
    uVar8 = (uint)(0 < iVar9);
  }
  return uVar8;
}

Assistant:

int av1_get_sbq_perceptual_ai(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                              int mi_row, int mi_col) {
  if (cpi->oxcf.enable_rate_guide_deltaq) {
    return get_rate_guided_quantizer(cpi, bsize, mi_row, mi_col);
  }

  const AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  int sb_wiener_var = get_var_perceptual_ai(cpi, bsize, mi_row, mi_col);
  int offset = 0;
  double beta = (double)cpi->norm_wiener_variance / sb_wiener_var;
  double min_max_scale = AOMMAX(1.0, get_max_scale(cpi, bsize, mi_row, mi_col));
  beta = 1.0 / AOMMIN(1.0 / beta, min_max_scale);

  // Cap beta such that the delta q value is not much far away from the base q.
  beta = AOMMIN(beta, 4);
  beta = AOMMAX(beta, 0.25);
  offset = av1_get_deltaq_offset(cm->seq_params->bit_depth, base_qindex, beta);
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  offset = AOMMIN(offset, delta_q_info->delta_q_res * 20 - 1);
  offset = AOMMAX(offset, -delta_q_info->delta_q_res * 20 + 1);
  int qindex = cm->quant_params.base_qindex + offset;
  qindex = AOMMIN(qindex, MAXQ);
  qindex = AOMMAX(qindex, MINQ);
  if (base_qindex > MINQ) qindex = AOMMAX(qindex, MINQ + 1);

  return qindex;
}